

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

string * __thiscall MlmWrap::getEndpoint_abi_cxx11_(string *__return_storage_ptr__,MlmWrap *this)

{
  network_pimpl *pnVar1;
  pointer pcVar2;
  
  pnVar1 = this->state;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pnVar1->endpoint)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pnVar1->endpoint)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string MlmWrap::getEndpoint() const{
    return state->getEndpoint();
}